

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assert.cpp
# Opt level: O0

void idx2::SetHandleAbortSignals(handler *Handler)

{
  handler *Handler_local;
  
  signal(6,(__sighandler_t)Handler);
  signal(0xb,(__sighandler_t)Handler);
  signal(7,(__sighandler_t)Handler);
  signal(4,(__sighandler_t)Handler);
  signal(8,(__sighandler_t)Handler);
  return;
}

Assistant:

void
SetHandleAbortSignals(handler& Handler)
{
  signal(SIGABRT, Handler);
  signal(SIGSEGV, Handler);
#if !defined(_WIN32)
  signal(SIGBUS, Handler);
#endif
  signal(SIGILL, Handler);
  signal(SIGFPE, Handler);
}